

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SourceTextModuleRecord.cpp
# Opt level: O3

HRESULT __thiscall
Js::SourceTextModuleRecord::ResolveExternalModuleDependencies(SourceTextModuleRecord *this)

{
  Type *addr;
  Var pvVar1;
  void *pvVar2;
  code *pcVar3;
  ScriptContext *scriptContext;
  bool bVar4;
  int iVar5;
  int iVar6;
  JavascriptString *pJVar7;
  undefined4 extraout_var;
  undefined4 *puVar9;
  Type *ppIVar10;
  undefined4 extraout_var_00;
  JavascriptError *pError;
  ModuleRecordBase *pMVar11;
  void *local_60;
  ModuleRecordBase *moduleRecordBase;
  ModuleRecordBase *local_50;
  ScriptContext *local_48;
  LPCOLESTR local_40;
  LPCOLESTR moduleName;
  char16_t *pcVar8;
  
  pvVar1 = (this->normalizedSpecifier).ptr;
  if (pvVar1 == (Var)0x0) {
    pcVar8 = L"module";
  }
  else {
    pJVar7 = VarTo<Js::JavascriptString>(pvVar1);
    iVar5 = (*(pJVar7->super_RecyclableObject).super_FinalizableObject.super_IRecyclerVisitedObject.
              _vptr_IRecyclerVisitedObject[0x65])(pJVar7);
    pcVar8 = (char16_t *)CONCAT44(extraout_var,iVar5);
  }
  iVar5 = 0;
  Output::TraceWithFlush(ModulePhase,L"ResolveExternalModuleDependencies(%s)\n",pcVar8);
  if ((this->requestedModuleList).ptr != (SList<Ident_*,_Memory::ArenaAllocator,_RealCount> *)0x0) {
    local_48 = (this->scriptContext).ptr;
    EnsureChildModuleSet(this,local_48);
    pMVar11 = (ModuleRecordBase *)(this->requestedModuleList).ptr;
    moduleRecordBase = pMVar11;
    local_50 = pMVar11;
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    iVar5 = 0;
    while( true ) {
      if (pMVar11 == (ModuleRecordBase *)0x0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        *puVar9 = 1;
        bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/SList.h"
                                    ,0x76,"(current != nullptr)","current != nullptr");
        if (!bVar4) {
          pcVar3 = (code *)invalidInstructionException();
          (*pcVar3)();
        }
        *puVar9 = 0;
        pMVar11 = local_50;
      }
      pMVar11 = (ModuleRecordBase *)
                (((SListBase<Ident_*,_Memory::ArenaAllocator,_RealCount> *)
                 &pMVar11->super_FinalizableObject)->super_SListNodeBase<Memory::ArenaAllocator>).
                next;
      if (pMVar11 == moduleRecordBase) break;
      local_50 = pMVar11;
      ppIVar10 = SListBase<Ident_*,_Memory::ArenaAllocator,_RealCount>::Iterator::Data
                           ((Iterator *)&moduleRecordBase);
      local_40 = (LPCOLESTR)&(*ppIVar10)->field_0x22;
      local_60 = (void *)0x0;
      moduleName = (LPCOLESTR)0x0;
      bVar4 = JsUtil::
              BaseDictionary<char16_t_const*,Js::SourceTextModuleRecord*,Memory::ArenaAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
              ::TryGetValue<char16_t_const*>
                        ((BaseDictionary<char16_t_const*,Js::SourceTextModuleRecord*,Memory::ArenaAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
                          *)(this->childrenModuleSet).ptr,&local_40,
                         (SourceTextModuleRecord **)&moduleName);
      pMVar11 = local_50;
      if (!bVar4) {
        iVar5 = (*local_48->hostScriptContext->_vptr_HostScriptContext[0x12])
                          (local_48->hostScriptContext,this,local_40,&local_60);
        if (iVar5 < 0) goto LAB_00b039ed;
        moduleName = (LPCOLESTR)FromHost(local_60);
        pvVar2 = (((SourceTextModuleRecord *)moduleName)->errorObject).ptr;
        if (pvVar2 != (void *)0x0) {
          Memory::Recycler::WBSetBit((char *)&this->errorObject);
          (this->errorObject).ptr = pvVar2;
          Memory::RecyclerWriteBarrierManager::WriteBarrier(&this->errorObject);
          iVar5 = -0x7fffbffb;
          goto LAB_00b039ed;
        }
        pvVar1 = (((SourceTextModuleRecord *)moduleName)->normalizedSpecifier).ptr;
        pcVar8 = L"module";
        if (pvVar1 != (Var)0x0) {
          pJVar7 = VarTo<Js::JavascriptString>(pvVar1);
          iVar6 = (*(pJVar7->super_RecyclableObject).super_FinalizableObject.
                    super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x65])(pJVar7);
          pcVar8 = (char16_t *)CONCAT44(extraout_var_00,iVar6);
        }
        Output::TraceWithFlush(ModulePhase,L"\t>SetParent in (%s)\n",pcVar8);
        SetParent((SourceTextModuleRecord *)moduleName,this,local_40);
        pMVar11 = local_50;
      }
    }
    if (iVar5 < 0) {
LAB_00b039ed:
      scriptContext = local_48;
      if ((this->errorObject).ptr == (void *)0x0) {
        addr = &this->errorObject;
        pError = JavascriptLibrary::CreateError
                           ((local_48->super_ScriptContextBase).javascriptLibrary);
        JavascriptError::SetErrorMessageProperties
                  (pError,iVar5,L"fetch import module failed",scriptContext);
        Memory::Recycler::WBSetBit((char *)addr);
        addr->ptr = pError;
        Memory::RecyclerWriteBarrierManager::WriteBarrier(addr);
      }
      Output::TraceWithFlush(ModulePhase,L"\tfetch import module failed\n");
      NotifyParentsAsNeeded(this);
    }
  }
  return iVar5;
}

Assistant:

HRESULT SourceTextModuleRecord::ResolveExternalModuleDependencies()
    {
        OUTPUT_TRACE_DEBUGONLY(Js::ModulePhase, _u("ResolveExternalModuleDependencies(%s)\n"), this->GetSpecifierSz());

        ScriptContext* scriptContext = GetScriptContext();

        HRESULT hr = NOERROR;
        if (requestedModuleList != nullptr)
        {
            EnsureChildModuleSet(scriptContext);

            requestedModuleList->MapUntil([&](IdentPtr specifier) {
                LPCOLESTR moduleName = specifier->Psz();
                ModuleRecordBase* moduleRecordBase = nullptr;
                SourceTextModuleRecord* moduleRecord = nullptr;
                bool itemFound = childrenModuleSet->TryGetValue(moduleName, &moduleRecord);
                if (!itemFound)
                {
                    hr = scriptContext->GetHostScriptContext()->FetchImportedModule(this, moduleName, &moduleRecordBase);
                    if (FAILED(hr))
                    {
                        return true;
                    }
                    moduleRecord = SourceTextModuleRecord::FromHost(moduleRecordBase);
                    Var errorObject = moduleRecord->GetErrorObject();
                    if (errorObject == nullptr)
                    {
                        OUTPUT_TRACE_DEBUGONLY(Js::ModulePhase, _u("\t>SetParent in (%s)\n"), moduleRecord->GetSpecifierSz());
                        moduleRecord->SetParent(this, moduleName);
                    }
                    else
                    {
                        this->errorObject = errorObject;
                        hr = E_FAIL;
                        return true;
                    }
                }
                return false;
            });

            if (FAILED(hr))
            {
                if (this->errorObject == nullptr)
                {
                    JavascriptError *error = scriptContext->GetLibrary()->CreateError();
                    JavascriptError::SetErrorMessageProperties(error, hr, _u("fetch import module failed"), scriptContext);
                    this->errorObject = error;
                }

                OUTPUT_TRACE_DEBUGONLY(Js::ModulePhase, _u("\tfetch import module failed\n"));
                NotifyParentsAsNeeded();
            }
        }
        return hr;
    }